

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DefaultClockingReferenceSyntax::setChild
          (DefaultClockingReferenceSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_004b48e4 + *(int *)(&DAT_004b48e4 + index * 4)))
            (&child,index,in_RDX,&DAT_004b48e4 + *(int *)(&DAT_004b48e4 + index * 4));
  return;
}

Assistant:

void DefaultClockingReferenceSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: defaultKeyword = child.token(); return;
        case 2: clocking = child.token(); return;
        case 3: name = child.token(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}